

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

void __thiscall
cmSourceFile::AppendProperty(cmSourceFile *this,string *prop,char *value,bool asString)

{
  __type _Var1;
  bool bVar2;
  
  cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
  _Var1 = std::operator==(prop,&propGENERATED_abi_cxx11_);
  if (_Var1) {
    bVar2 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_);
    this->IsGenerated = bVar2;
  }
  return;
}

Assistant:

void cmSourceFile::AppendProperty(const std::string& prop, const char* value,
                                  bool asString)
{
  this->Properties.AppendProperty(prop, value, asString);

  // Update IsGenerated flag
  if (prop == propGENERATED) {
    this->IsGenerated = this->GetPropertyAsBool(propGENERATED);
  }
}